

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

void plug_proxy_receive(Plug *p,int urgent,char *data,size_t len)

{
  undefined4 in_register_00000034;
  
  if (p[-0xb].vt != (PlugVtable *)0x0) {
    bufchain_add((bufchain *)(p + -0x11),data,len);
    proxy_negotiate((ProxySocket *)(p + -0x22));
    return;
  }
  (**(code **)((p[-0x20].vt)->log + 0x10))(p[-0x20].vt,CONCAT44(in_register_00000034,urgent));
  return;
}

Assistant:

static void plug_proxy_receive(
    Plug *p, int urgent, const char *data, size_t len)
{
    ProxySocket *ps = container_of(p, ProxySocket, plugimpl);

    if (ps->pn) {
        /* we will lose the urgentness of this data, but since most,
         * if not all, of this data will be consumed by the negotiation
         * process, hopefully it won't affect the protocol above us
         */
        bufchain_add(&ps->pending_input_data, data, len);
        proxy_negotiate(ps);
    } else {
        plug_receive(ps->plug, urgent, data, len);
    }
}